

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::CreateOutputAnimation(SMDImporter *this,int index,string *name)

{
  float fVar1;
  float fYaw;
  double dVar2;
  aiAnimation **ppaVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  aiAnimation *paVar7;
  aiAnimation **ppaVar8;
  long lVar9;
  char *sz;
  size_type sVar10;
  ulong uVar11;
  aiNodeAnim **ppaVar12;
  aiNodeAnim *this_00;
  pointer pString;
  reference pBVar13;
  ulong uVar14;
  MatrixKey *pMVar15;
  reference pMVar16;
  MatrixKey *local_f0;
  aiQuatKey *local_c8;
  aiQuaterniont<float> local_88;
  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
  local_78;
  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
  local_70;
  const_iterator qq;
  aiQuatKey *pRotKeys;
  aiVectorKey *pVecKeys;
  aiNodeAnim *p;
  __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
  local_48;
  __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
  local_40;
  const_iterator i;
  uint a;
  aiNodeAnim **pp;
  aiAnimation **anim;
  string *name_local;
  int index_local;
  SMDImporter *this_local;
  
  paVar7 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar7);
  ppaVar3 = this->pScene->mAnimations;
  ppaVar8 = ppaVar3 + index;
  ppaVar3[index] = paVar7;
  lVar9 = std::__cxx11::string::length();
  if (lVar9 != 0) {
    paVar7 = *ppaVar8;
    sz = (char *)std::__cxx11::string::c_str();
    aiString::Set(&paVar7->mName,sz);
  }
  (*ppaVar8)->mDuration = this->dLengthOfAnim;
  sVar10 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size(&this->asBones);
  (*ppaVar8)->mNumChannels = (uint)sVar10;
  (*ppaVar8)->mTicksPerSecond = 25.0;
  auVar5 = ZEXT416((*ppaVar8)->mNumChannels) * ZEXT816(8);
  uVar11 = auVar5._0_8_;
  if (auVar5._8_8_ != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  ppaVar12 = (aiNodeAnim **)operator_new__(uVar11);
  (*ppaVar8)->mChannels = ppaVar12;
  i._M_current._4_4_ = 0;
  local_48._M_current =
       (Bone *)std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::begin
                         (&this->asBones);
  __gnu_cxx::
  __normal_iterator<Assimp::SMD::Bone_const*,std::vector<Assimp::SMD::Bone,std::allocator<Assimp::SMD::Bone>>>
  ::__normal_iterator<Assimp::SMD::Bone*>
            ((__normal_iterator<Assimp::SMD::Bone_const*,std::vector<Assimp::SMD::Bone,std::allocator<Assimp::SMD::Bone>>>
              *)&local_40,&local_48);
  while( true ) {
    p = (aiNodeAnim *)
        std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::end(&this->asBones);
    bVar6 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
                        *)&p);
    if (!bVar6) break;
    this_00 = (aiNodeAnim *)operator_new(0x438);
    aiNodeAnim::aiNodeAnim(this_00);
    ppaVar12[i._M_current._4_4_] = this_00;
    pString = __gnu_cxx::
              __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
              ::operator->(&local_40);
    aiString::Set((aiString *)this_00,&pString->mName);
    pBVar13 = __gnu_cxx::
              __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
              ::operator*(&local_40);
    sVar10 = std::
             vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
             ::size(&(pBVar13->sAnim).asKeys);
    this_00->mNumRotationKeys = (uint)sVar10;
    if (this_00->mNumRotationKeys != 0) {
      this_00->mNumPositionKeys = this_00->mNumRotationKeys;
      uVar11 = CONCAT44(0,this_00->mNumRotationKeys);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar11;
      uVar14 = SUB168(auVar5 * ZEXT816(0x18),0);
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pRotKeys = (aiQuatKey *)operator_new__(uVar14);
      if (uVar11 != 0) {
        local_c8 = pRotKeys;
        do {
          aiVectorKey::aiVectorKey((aiVectorKey *)local_c8);
          local_c8 = local_c8 + 1;
        } while (local_c8 != pRotKeys + uVar11);
      }
      this_00->mPositionKeys = (aiVectorKey *)pRotKeys;
      uVar11 = CONCAT44(0,this_00->mNumRotationKeys);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar11;
      uVar14 = SUB168(auVar4 * ZEXT816(0x18),0);
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pMVar15 = (MatrixKey *)operator_new__(uVar14);
      if (uVar11 != 0) {
        local_f0 = pMVar15;
        do {
          aiQuatKey::aiQuatKey((aiQuatKey *)local_f0);
          local_f0 = (MatrixKey *)&(local_f0->matrix).b3;
        } while (local_f0 != (MatrixKey *)((long)&(pMVar15->matrix).a1 + uVar11 * 3 * 8));
      }
      this_00->mRotationKeys = (aiQuatKey *)pMVar15;
      qq._M_current = pMVar15;
      pBVar13 = __gnu_cxx::
                __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
                ::operator*(&local_40);
      local_70._M_current =
           (MatrixKey *)
           std::
           vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
           ::begin(&(pBVar13->sAnim).asKeys);
      while( true ) {
        pBVar13 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
                  ::operator*(&local_40);
        local_78._M_current =
             (MatrixKey *)
             std::
             vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
             ::end(&(pBVar13->sAnim).asKeys);
        bVar6 = __gnu_cxx::operator!=(&local_70,&local_78);
        if (!bVar6) break;
        pMVar16 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
                  ::operator*(&local_70);
        dVar2 = pMVar16->dTime;
        pRotKeys->mTime = dVar2;
        *(double *)&(qq._M_current)->matrix = dVar2;
        pMVar16 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
                  ::operator*(&local_70);
        fVar1 = (pMVar16->vRot).y;
        pMVar16 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
                  ::operator*(&local_70);
        fYaw = (pMVar16->vRot).z;
        pMVar16 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
                  ::operator*(&local_70);
        aiQuaterniont<float>::aiQuaterniont(&local_88,fVar1,fYaw,(pMVar16->vRot).x);
        ((qq._M_current)->matrix).a3 = local_88.w;
        ((qq._M_current)->matrix).a4 = local_88.x;
        ((qq._M_current)->matrix).b1 = local_88.y;
        ((qq._M_current)->matrix).b2 = local_88.z;
        pMVar16 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
                  ::operator*(&local_70);
        fVar1 = (pMVar16->vPos).y;
        (pRotKeys->mValue).w = (pMVar16->vPos).x;
        (pRotKeys->mValue).x = fVar1;
        (pRotKeys->mValue).y = (pMVar16->vPos).z;
        pRotKeys = pRotKeys + 1;
        qq._M_current = (MatrixKey *)&((qq._M_current)->matrix).b3;
        __gnu_cxx::
        __normal_iterator<const_Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
        ::operator++(&local_70);
      }
    }
    i._M_current._4_4_ = i._M_current._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputAnimation(int index, const std::string &name) {
    aiAnimation*& anim = pScene->mAnimations[index] = new aiAnimation();

    if (name.length()) {
        anim->mName.Set(name.c_str());
    }
    anim->mDuration = dLengthOfAnim;
    anim->mNumChannels = static_cast<unsigned int>( asBones.size() );
    anim->mTicksPerSecond = 25.0; // FIXME: is this correct?

    aiNodeAnim** pp = anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // now build valid keys
    unsigned int a = 0;
    for (std::vector<SMD::Bone>::const_iterator i = asBones.begin(); i != asBones.end(); ++i) {
        aiNodeAnim* p = pp[a] = new aiNodeAnim();

        // copy the name of the bone
        p->mNodeName.Set(i->mName);

        p->mNumRotationKeys = (unsigned int)(*i).sAnim.asKeys.size();
        if (p->mNumRotationKeys){
            p->mNumPositionKeys = p->mNumRotationKeys;
            aiVectorKey* pVecKeys = p->mPositionKeys = new aiVectorKey[p->mNumRotationKeys];
            aiQuatKey* pRotKeys = p->mRotationKeys = new aiQuatKey[p->mNumRotationKeys];

            for (std::vector<SMD::Bone::Animation::MatrixKey>::const_iterator
                    qq = (*i).sAnim.asKeys.begin();
                    qq != (*i).sAnim.asKeys.end(); ++qq) {
                pRotKeys->mTime = pVecKeys->mTime = (*qq).dTime;

                // compute the rotation quaternion from the euler angles
                // aiQuaternion: The order of the parameters is yzx?
                pRotKeys->mValue = aiQuaternion((*qq).vRot.y, (*qq).vRot.z, (*qq).vRot.x);
                pVecKeys->mValue = (*qq).vPos;

                ++pVecKeys; ++pRotKeys;
            }
        }
        ++a;

        // there are no scaling keys ...
    }
}